

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O1

void bcm2835_pwm_set_data(uint8_t channel,uint32_t data)

{
  uint32_t *puVar1;
  
  if (bcm2835_pwm != (uint32_t *)0xffffffffffffffff && bcm2835_clk != (uint32_t *)0xffffffffffffffff
     ) {
    if (channel == '\x01') {
      puVar1 = bcm2835_pwm + 9;
    }
    else {
      if (channel != '\0') {
        return;
      }
      puVar1 = bcm2835_pwm + 5;
    }
    if (debug != '\0') {
      printf("bcm2835_peri_write_nb paddr %p, value %08X\n");
      return;
    }
    *puVar1 = data;
  }
  return;
}

Assistant:

void bcm2835_pwm_set_data(uint8_t channel, uint32_t data)
{
  if (   bcm2835_clk == MAP_FAILED
       || bcm2835_pwm == MAP_FAILED)
    return; /* bcm2835_init() failed or not root */

  if (channel == 0)
      bcm2835_peri_write_nb(bcm2835_pwm + BCM2835_PWM0_DATA, data);
  else if (channel == 1)
      bcm2835_peri_write_nb(bcm2835_pwm + BCM2835_PWM1_DATA, data);
}